

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

bool slang::syntax::PatternSyntax::isKind(SyntaxKind kind)

{
  bool bVar1;
  
  bVar1 = true;
  if ((((kind != ExpressionPattern) && (kind != ParenthesizedPattern)) && (kind != StructurePattern)
      ) && (((kind != TaggedPattern && (kind != VariablePattern)) && (kind != WildcardPattern)))) {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool PatternSyntax::isKind(SyntaxKind kind) {
    switch (kind) {
        case SyntaxKind::ExpressionPattern:
        case SyntaxKind::ParenthesizedPattern:
        case SyntaxKind::StructurePattern:
        case SyntaxKind::TaggedPattern:
        case SyntaxKind::VariablePattern:
        case SyntaxKind::WildcardPattern:
            return true;
        default:
            return false;
    }
}